

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic_instances.c
# Opt level: O0

picnic_instance_t * picnic_instance_get(picnic_params_t param)

{
  picnic_instance_t *local_28;
  uint local_1c;
  picnic_instance_t *pp;
  picnic_params_t param_local;
  picnic_instance_t *local_8;
  
  if ((param == PARAMETER_SET_INVALID) || (Picnic_L5_full < param)) {
    local_8 = (picnic_instance_t *)0x0;
  }
  else {
    if (param < Picnic3_L1) {
      local_1c = param - Picnic_L1_FS >> 1;
    }
    else {
      local_1c = param - Picnic_L3_UR;
    }
    local_28 = instances + local_1c;
    if ((local_28->lowmc).n == 0) {
      local_28 = (picnic_instance_t *)0x0;
    }
    local_8 = local_28;
  }
  return local_8;
}

Assistant:

const picnic_instance_t* picnic_instance_get(picnic_params_t param) {
  if (param <= PARAMETER_SET_INVALID || param >= PARAMETER_SET_MAX_INDEX) {
    return NULL;
  }
#if !defined(WITH_UNRUH)
  // because the FS and Unruh instances are interleaved, we need to explicitely check for them
  if (picnic_instance_is_unruh(param)) {
    return NULL;
  }
#endif

  const picnic_instance_t* pp =
      &instances[param <= Picnic_L5_UR ? (param - 1) / 2 : param - Picnic3_L1 + 3];
  // check if the LowMC instance and ZKBPP/KKW are enabled
  return pp->lowmc.n ? pp : NULL;
}